

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<24U,_unsigned_char,_void,_false> * __thiscall
math::wide_integer::uintwide_t<24U,_unsigned_char,_void,_false>::operator+=
          (uintwide_t<24U,_unsigned_char,_void,_false> *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *other)

{
  iterator puVar1;
  const_iterator puVar2;
  const_iterator puVar3;
  array<unsigned_char,_3UL> local_1b;
  limb_type_conflict1 carry_1;
  limb_type_conflict1 carry;
  array<unsigned_char,_3UL> *paStack_18;
  uintwide_t<24U,_unsigned_char,_void,_false> self;
  uintwide_t<24U,_unsigned_char,_void,_false> *other_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *this_local;
  
  paStack_18 = (array<unsigned_char,_3UL> *)other;
  if (this == other) {
    local_1b.elems._0_2_ = *(undefined2 *)(other->values).super_array<unsigned_char,_3UL>.elems;
    local_1b.elems[2] = (other->values).super_array<unsigned_char,_3UL>.elems[2];
    puVar1 = detail::array_detail::array<unsigned_char,_3UL>::begin
                       ((array<unsigned_char,_3UL> *)this);
    puVar2 = detail::array_detail::array<unsigned_char,_3UL>::cbegin
                       ((array<unsigned_char,_3UL> *)this);
    puVar3 = detail::array_detail::array<unsigned_char,_3UL>::cbegin(&local_1b);
    uintwide_t<24u,unsigned_char,void,false>::
    eval_add_n<unsigned_char*,unsigned_char_const*,unsigned_char_const*>
              (puVar1,puVar2,puVar3,3,'\0');
  }
  else {
    puVar1 = detail::array_detail::array<unsigned_char,_3UL>::begin
                       ((array<unsigned_char,_3UL> *)this);
    puVar2 = detail::array_detail::array<unsigned_char,_3UL>::cbegin
                       ((array<unsigned_char,_3UL> *)this);
    puVar3 = detail::array_detail::array<unsigned_char,_3UL>::cbegin(paStack_18);
    uintwide_t<24u,unsigned_char,void,false>::
    eval_add_n<unsigned_char*,unsigned_char_const*,unsigned_char_const*>
              (puVar1,puVar2,puVar3,3,'\0');
  }
  return this;
}

Assistant:

constexpr auto operator+=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t self(other); // NOLINT(performance-unnecessary-copy-initialization)

        // Unary addition function.
        const auto carry = eval_add_n(values.begin(), // LCOV_EXCL_LINE
                                      values.cbegin(),
                                      self.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }
      else
      {
        // Unary addition function.
        const auto carry = eval_add_n(values.begin(),
                                      values.cbegin(),
                                      other.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }

      return *this;
    }